

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

IntBone_MDL7 ** __thiscall Assimp::MDLImporter::LoadBones_3DGS_MDL7(MDLImporter *this)

{
  uchar *puVar1;
  IntBone_MDL7 **apcOutBones;
  IntBone_MDL7 *this_00;
  Logger *this_01;
  ulong uVar2;
  
  puVar1 = this->mBuffer;
  if ((ulong)*(uint *)(puVar1 + 8) != 0) {
    if (((ulong)*(ushort *)(puVar1 + 0x1c) < 0x31) &&
       ((0x1001000010000U >> ((ulong)*(ushort *)(puVar1 + 0x1c) & 0x3f) & 1) != 0)) {
      apcOutBones = (IntBone_MDL7 **)operator_new__((ulong)*(uint *)(puVar1 + 8) << 3);
      if (*(int *)(puVar1 + 8) != 0) {
        uVar2 = 0;
        do {
          this_00 = (IntBone_MDL7 *)operator_new(0x4c0);
          MDL::IntBone_MDL7::IntBone_MDL7(this_00);
          apcOutBones[uVar2] = this_00;
          uVar2 = uVar2 + 1;
        } while (uVar2 < *(uint *)(puVar1 + 8));
      }
      CalcAbsBoneMatrices_3DGS_MDL7(this,apcOutBones);
      return apcOutBones;
    }
    this_01 = DefaultLogger::get();
    Logger::warn(this_01,"Unknown size of bone data structure");
  }
  return (IntBone_MDL7 **)0x0;
}

Assistant:

MDL::IntBone_MDL7** MDLImporter::LoadBones_3DGS_MDL7()
{
  const MDL::Header_MDL7 *pcHeader = (const MDL::Header_MDL7*)this->mBuffer;
    if (pcHeader->bones_num)    {
        // validate the size of the bone data structure in the file
        if (AI_MDL7_BONE_STRUCT_SIZE__NAME_IS_20_CHARS  != pcHeader->bone_stc_size &&
            AI_MDL7_BONE_STRUCT_SIZE__NAME_IS_32_CHARS  != pcHeader->bone_stc_size &&
            AI_MDL7_BONE_STRUCT_SIZE__NAME_IS_NOT_THERE != pcHeader->bone_stc_size)
        {
            ASSIMP_LOG_WARN("Unknown size of bone data structure");
            return NULL;
        }

        MDL::IntBone_MDL7** apcBonesOut = new MDL::IntBone_MDL7*[pcHeader->bones_num];
        for (uint32_t crank = 0; crank < pcHeader->bones_num;++crank)
            apcBonesOut[crank] = new MDL::IntBone_MDL7();

        // and calculate absolute bone offset matrices ...
        CalcAbsBoneMatrices_3DGS_MDL7(apcBonesOut);
        return apcBonesOut;
    }
    return NULL;
}